

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveWriter.cpp
# Opt level: O3

EStatusCode __thiscall
CFFPrimitiveWriter::WriteRealOperand(CFFPrimitiveWriter *this,double inValue,long inFractalLength)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  EStatusCode EVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  _func_int **pp_Var6;
  undefined4 extraout_var_05;
  long lVar7;
  ulong uVar8;
  ushort uVar9;
  byte *pbVar10;
  IByteWriter *pIVar11;
  undefined8 unaff_R12;
  ulong uVar12;
  byte bVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar16;
  byte local_6a;
  bool local_69 [3];
  byte local_66;
  byte local_65;
  byte local_64;
  byte local_63;
  byte local_62 [2];
  undefined8 local_60;
  double local_58;
  ulong uStack_50;
  undefined1 local_48 [16];
  
  dVar16 = -inValue;
  uStack_50 = CONCAT44(in_XMM0_Dd,in_XMM0_Dc) ^ 0x8000000000000000;
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = inValue;
  local_48._12_4_ = in_XMM0_Dd;
  local_58 = dVar16;
  if (dVar16 <= inValue) {
    local_58 = inValue;
  }
  local_60 = floor(local_58);
  local_58 = local_58 - local_60;
  if ((local_58 != 0.0) || (NAN(local_58))) {
    if ((local_60 != 0.0) || ((NAN(local_60) || (0.001 < local_58)))) goto LAB_001fe55d;
    bVar2 = true;
    if (0.1 <= local_58) {
      uVar12 = 0;
      goto LAB_001fe59b;
    }
    uVar9 = 0;
    do {
      uVar9 = uVar9 + 1;
      local_58 = local_58 * 10.0;
    } while (local_58 < 0.1);
    uVar12 = 0;
  }
  else {
    lVar7 = (long)local_60;
    if ((local_60 < 1000.0) || (lVar7 != (lVar7 / 1000) * 1000)) {
LAB_001fe55d:
      uVar9 = 0;
      bVar2 = false;
      uVar12 = 0;
    }
    else {
      uVar8 = lVar7 * -0x3333333333333333 + 0x1999999999999998;
      uVar12 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
      if ((uVar8 >> 1 | (ulong)((uVar8 & 1) != 0) << 0x3f) < 0x1999999999999999) {
        uVar9 = 0;
        do {
          uVar9 = uVar9 + 1;
          local_60 = local_60 / 10.0;
          uVar8 = (long)local_60 * -0x3333333333333333 + 0x1999999999999998;
        } while ((uVar8 >> 1 | (ulong)((uVar8 & 1) != 0) << 0x3f) < 0x1999999999999999);
        bVar2 = false;
      }
      else {
        bVar2 = false;
LAB_001fe59b:
        uVar9 = 0;
      }
    }
  }
  local_69[1] = true;
  if (this->mInternalState == eFailure) {
    return eFailure;
  }
  iVar4 = (*this->mCFFOutput->_vptr_IByteWriter[2])(this->mCFFOutput,local_69 + 1,1);
  if (CONCAT44(extraout_var,iVar4) == 1) {
    local_6a = (0.0 <= (double)local_48._0_8_) * ' ' - 0x20;
    local_69[0] = inValue < dVar16;
    if ((local_60 != 0.0) || (NAN(local_60))) {
      EVar5 = WriteIntegerOfReal(this,local_60,&local_6a,local_69);
      bVar13 = local_69[0];
      if (EVar5 != eSuccess) {
        return eFailure;
      }
    }
    else if ((double)local_48._0_8_ < 0.0) {
      local_69[2] = true;
      if (this->mInternalState == eFailure) {
        return eFailure;
      }
      iVar4 = (*this->mCFFOutput->_vptr_IByteWriter[2])(this->mCFFOutput,local_69 + 2,1);
      if (CONCAT44(extraout_var_00,iVar4) != 1) goto LAB_001fe8e1;
      local_6a = 0;
      bVar13 = 0;
    }
    else {
      local_6a = 0;
      local_69[0] = true;
      bVar13 = 1;
    }
    if ((0 < inFractalLength) && ((local_58 != 0.0 || (NAN(local_58))))) {
      if ((bVar13 & 1) == 0) {
        bVar3 = 0xa0;
        bVar13 = 1;
        dVar16 = local_58;
      }
      else {
        local_66 = local_6a | 10;
        if (this->mInternalState == eFailure) {
          return eFailure;
        }
        iVar4 = (*this->mCFFOutput->_vptr_IByteWriter[2])(this->mCFFOutput,&local_66,1);
        if (CONCAT44(extraout_var_01,iVar4) != 1) goto LAB_001fe8e1;
        bVar13 = 0;
        bVar3 = 0;
        dVar16 = local_58;
      }
      local_60 = (double)CONCAT44(local_60._4_4_,(int)uVar12);
      do {
        local_58 = dVar16;
        dVar16 = floor(dVar16 * 10.0);
        uVar14 = SUB84(dVar16,0);
        uVar15 = (undefined4)((ulong)dVar16 >> 0x20);
        if (bVar13 == 0) {
          bVar3 = (byte)(int)dVar16 << 4;
          bVar13 = 1;
        }
        else {
          local_65 = bVar3 | (byte)(int)dVar16;
          if (this->mInternalState == eFailure) {
            return eFailure;
          }
          local_48._0_8_ = dVar16;
          iVar4 = (*this->mCFFOutput->_vptr_IByteWriter[2])(this->mCFFOutput,&local_65,1);
          if (CONCAT44(extraout_var_02,iVar4) != 1) goto LAB_001fe8e1;
          bVar3 = 0;
          bVar13 = 0;
          uVar14 = local_48._0_4_;
          uVar15 = local_48._4_4_;
        }
        dVar16 = local_58 * 10.0 - (double)CONCAT44(uVar15,uVar14);
      } while (((dVar16 != 0.0) || (NAN(dVar16))) &&
              (bVar1 = 1 < inFractalLength, inFractalLength = inFractalLength + -1, bVar1));
      uVar12 = (ulong)local_60 & 0xffffffff;
      local_6a = bVar3;
    }
    if (bVar2) {
      if ((bVar13 & 1) == 0) {
        local_69[0] = true;
        local_6a = 0xc0;
      }
      else {
        local_64 = local_6a | 0xc;
        if (this->mInternalState == eFailure) {
          return eFailure;
        }
        iVar4 = (*this->mCFFOutput->_vptr_IByteWriter[2])(this->mCFFOutput,&local_64,1);
        if (CONCAT44(extraout_var_03,iVar4) != 1) goto LAB_001fe8e1;
        local_6a = 0;
        local_69[0] = false;
      }
      EVar5 = WriteIntegerOfReal(this,(double)uVar9,&local_6a,local_69);
      bVar13 = local_69[0];
      if (EVar5 != eSuccess) {
        return eFailure;
      }
    }
    if ((char)uVar12 != '\0') {
      if ((bVar13 & 1) == 0) {
        local_69[0] = true;
        local_6a = 0xb0;
      }
      else {
        local_63 = local_6a | 0xb;
        if (this->mInternalState == eFailure) {
          return eFailure;
        }
        iVar4 = (*this->mCFFOutput->_vptr_IByteWriter[2])(this->mCFFOutput,&local_63,1);
        if (CONCAT44(extraout_var_04,iVar4) != 1) goto LAB_001fe8e1;
        local_6a = 0;
        local_69[0] = false;
      }
      EVar5 = WriteIntegerOfReal(this,(double)uVar9,&local_6a,local_69);
      bVar13 = local_69[0];
      if (EVar5 != eSuccess) {
        return eFailure;
      }
    }
    if ((bVar13 & 1) == 0) {
      local_62[1] = 0xff;
      if (this->mInternalState == eFailure) {
        return eFailure;
      }
      pIVar11 = this->mCFFOutput;
      pp_Var6 = pIVar11->_vptr_IByteWriter;
      pbVar10 = local_62 + 1;
    }
    else {
      local_62[0] = local_6a | 0xf;
      if (this->mInternalState == eFailure) {
        return eFailure;
      }
      pIVar11 = this->mCFFOutput;
      pp_Var6 = pIVar11->_vptr_IByteWriter;
      pbVar10 = local_62;
    }
    iVar4 = (*pp_Var6[2])(pIVar11,pbVar10,1);
    if (CONCAT44(extraout_var_05,iVar4) == 1) {
      return eSuccess;
    }
  }
LAB_001fe8e1:
  this->mInternalState = eFailure;
  return eFailure;
}

Assistant:

EStatusCode CFFPrimitiveWriter::WriteRealOperand(double inValue,long inFractalLength)
{
	// first, calculate the proper formatting
    
	bool minusSign = inValue < 0;
	bool minusExponent = false;
	bool plusExponent = false;
	unsigned short exponentSize = 0;
    
	if(minusSign)
		inValue = -inValue;
    
	double integerValue = floor(inValue);
	double fractalValue = inValue - integerValue;
    
	if(0 == fractalValue)
	{
		if(long(integerValue) % 1000 == 0 && integerValue >= 1000) // bother only if larger than 1000
		{
			plusExponent = true;
			while(long(integerValue) % 10 == 0)
			{
				++exponentSize;
				integerValue = integerValue / 10;
			}
		}
	}
    else if(0 == integerValue)
	{
		if(fractalValue <= 0.001) // bother only if < 0.001
		{
			minusExponent = true;
			while(fractalValue < 0.1)
			{
				++exponentSize;
				fractalValue = fractalValue * 10;
			}
		}
	}
    
	// now let's get to work
	if(WriteByte(30) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;
    
	// first, take care of minus sign
	Byte buffer = minusSign ? 0xe0 : 0;
	bool usedFirst = minusSign;
    
	// Integer part
	if(integerValue != 0)
	{
	        if(WriteIntegerOfReal(integerValue,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
        }
	else
	{
		if(SetOrWriteNibble(0,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
	}

	// Fractal part (if there was an integer or not)
	if(fractalValue != 0 && inFractalLength > 0)
	{
		if(SetOrWriteNibble(0xa,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;

		while(fractalValue != 0 && inFractalLength > 0)
		{
			if(SetOrWriteNibble((Byte)floor(fractalValue * 10),buffer,usedFirst) != PDFHummus::eSuccess)
				return PDFHummus::eFailure;
			fractalValue = fractalValue * 10 - floor(fractalValue * 10);
			--inFractalLength;
		}
	}
    
	// now, if there's any exponent, write it
	if(minusExponent)
	{
		if(SetOrWriteNibble(0xc,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
		if(WriteIntegerOfReal(exponentSize,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
	}
	if(plusExponent)
	{
		if(SetOrWriteNibble(0xb,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
		if(WriteIntegerOfReal(exponentSize,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
	}
    
	// final f or ff
	if(usedFirst)
		return SetOrWriteNibble(0xf,buffer,usedFirst);
	else
		return WriteByte(0xff);
    
}